

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

double Catch::anon_unknown_1::step<double>(double start,double direction,uint64_t steps)

{
  ulong in_RDI;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  uint64_t i;
  undefined8 local_20;
  undefined8 local_8;
  
  local_8 = in_XMM0_Qa;
  for (local_20 = 0; local_20 < in_RDI; local_20 = local_20 + 1) {
    local_8 = nextafter(local_8,in_XMM1_Qa);
  }
  return local_8;
}

Assistant:

FP step(FP start, FP direction, uint64_t steps) {
    for (uint64_t i = 0; i < steps; ++i) {
#if defined(CATCH_CONFIG_GLOBAL_NEXTAFTER)
        start = Catch::nextafter(start, direction);
#else
        start = std::nextafter(start, direction);
#endif
    }
    return start;
}